

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logical_get.cpp
# Opt level: O3

vector<duckdb::ColumnBinding,_true> * __thiscall
duckdb::LogicalGet::GetColumnBindings
          (vector<duckdb::ColumnBinding,_true> *__return_storage_ptr__,LogicalGet *this)

{
  pointer *ppCVar1;
  ulong *puVar2;
  size_type *psVar3;
  iterator __position;
  idx_t iVar4;
  reference this_00;
  pointer pLVar5;
  reference __args;
  InternalException *this_01;
  iterator __begin2;
  ulong *puVar6;
  size_type *psVar7;
  initializer_list<duckdb::ColumnBinding> __l;
  unsigned_long proj_id;
  allocator_type local_51;
  string local_50;
  
  if ((this->column_ids).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->column_ids).super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
      super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    local_50._M_dataplus._M_p = (pointer)this->table_index;
    local_50._M_string_length = 0;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_50;
    ::std::vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>::vector
              (&__return_storage_ptr__->
                super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>,__l,
               &local_51);
  }
  else {
    (__return_storage_ptr__->
    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
    super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    puVar6 = (this->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar2 = (this->projection_ids).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar6 == puVar2) {
      local_50._M_dataplus._M_p = (pointer)0x0;
      do {
        ::std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>::
        emplace_back<unsigned_long&,unsigned_long&>
                  ((vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>> *)
                   __return_storage_ptr__,&this->table_index,(unsigned_long *)&local_50);
        local_50._M_dataplus._M_p = local_50._M_dataplus._M_p + 1;
      } while (local_50._M_dataplus._M_p <
               (pointer)((long)(this->column_ids).
                               super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                               .
                               super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->column_ids).
                               super_vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                               .
                               super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    else {
      do {
        local_50._M_dataplus._M_p = (pointer)*puVar6;
        ::std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>::
        emplace_back<unsigned_long&,unsigned_long&>
                  ((vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>> *)
                   __return_storage_ptr__,&this->table_index,(unsigned_long *)&local_50);
        puVar6 = puVar6 + 1;
      } while (puVar6 != puVar2);
    }
    if ((this->projected_input).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (this->projected_input).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      if ((long)(this->super_LogicalOperator).children.
                super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->super_LogicalOperator).children.
                super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                .
                super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 8) {
        this_01 = (InternalException *)__cxa_allocate_exception(0x10);
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_50,
                   "LogicalGet::project_input can only be set for table-in-out functions","");
        InternalException::InternalException(this_01,&local_50);
        __cxa_throw(this_01,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
      }
      this_00 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                ::operator[](&(this->super_LogicalOperator).children,0);
      pLVar5 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
               ::operator->(this_00);
      (*pLVar5->_vptr_LogicalOperator[2])(&local_50,pLVar5);
      psVar7 = (this->projected_input).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      psVar3 = (this->projected_input).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if (psVar7 != psVar3) {
        do {
          __args = vector<duckdb::ColumnBinding,_true>::operator[]
                             ((vector<duckdb::ColumnBinding,_true> *)&local_50,*psVar7);
          __position._M_current =
               (__return_storage_ptr__->
               super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
               super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->
              super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
              super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>>::
            _M_realloc_insert<duckdb::ColumnBinding&>
                      ((vector<duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>> *)
                       __return_storage_ptr__,__position,__args);
          }
          else {
            iVar4 = __args->column_index;
            (__position._M_current)->table_index = __args->table_index;
            (__position._M_current)->column_index = iVar4;
            ppCVar1 = &(__return_storage_ptr__->
                       super_vector<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>).
                       super__Vector_base<duckdb::ColumnBinding,_std::allocator<duckdb::ColumnBinding>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppCVar1 = *ppCVar1 + 1;
          }
          psVar7 = psVar7 + 1;
        } while (psVar7 != psVar3);
      }
      if (local_50._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_50._M_dataplus._M_p);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

vector<ColumnBinding> LogicalGet::GetColumnBindings() {
	if (column_ids.empty()) {
		return {ColumnBinding(table_index, 0)};
	}
	vector<ColumnBinding> result;
	if (projection_ids.empty()) {
		for (idx_t col_idx = 0; col_idx < column_ids.size(); col_idx++) {
			result.emplace_back(table_index, col_idx);
		}
	} else {
		for (auto proj_id : projection_ids) {
			result.emplace_back(table_index, proj_id);
		}
	}
	if (!projected_input.empty()) {
		if (children.size() != 1) {
			throw InternalException("LogicalGet::project_input can only be set for table-in-out functions");
		}
		auto child_bindings = children[0]->GetColumnBindings();
		for (auto entry : projected_input) {
			D_ASSERT(entry < child_bindings.size());
			result.emplace_back(child_bindings[entry]);
		}
	}
	return result;
}